

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O2

void __thiscall Disk::resize(Disk *this,int new_cyls,int new_heads)

{
  map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
  *this_00;
  int iVar1;
  iterator __position;
  CylHead local_30;
  
  this_00 = &this->m_trackdata;
  if (new_heads == 0 && new_cyls == 0) {
    std::
    _Rb_tree<CylHead,_std::pair<const_CylHead,_TrackData>,_std::_Select1st<std::pair<const_CylHead,_TrackData>_>,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
    ::clear(&this_00->_M_t);
    return;
  }
  __position._M_node = (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)__position._M_node !=
         &(this->m_trackdata)._M_t._M_impl.super__Rb_tree_header) {
    if (((int)__position._M_node[1]._M_color < new_cyls) &&
       (*(int *)&__position._M_node[1].field_0x4 < new_heads)) {
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    }
    else {
      __position = std::
                   _Rb_tree<CylHead,std::pair<CylHead_const,TrackData>,std::_Select1st<std::pair<CylHead_const,TrackData>>,std::less<CylHead>,std::allocator<std::pair<CylHead_const,TrackData>>>
                   ::erase_abi_cxx11_((_Rb_tree<CylHead,std::pair<CylHead_const,TrackData>,std::_Select1st<std::pair<CylHead_const,TrackData>>,std::less<CylHead>,std::allocator<std::pair<CylHead_const,TrackData>>>
                                       *)this_00,__position);
    }
  }
  iVar1 = cyls(this);
  if ((new_cyls <= iVar1) && (iVar1 = heads(this), new_heads <= iVar1)) {
    return;
  }
  CylHead::CylHead(&local_30,new_cyls + -1,new_heads + -1);
  std::
  map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
  ::operator[](this_00,&local_30);
  return;
}

Assistant:

void Disk::resize(int new_cyls, int new_heads)
{
    if (!new_cyls && !new_heads)
    {
        m_trackdata.clear();
        return;
    }

    // Remove tracks beyond the new extent
    for (auto it = m_trackdata.begin(); it != m_trackdata.end(); )
    {
        if (it->first.cyl >= new_cyls || it->first.head >= new_heads)
            it = m_trackdata.erase(it);
        else
            ++it;
    }

    // If the disk is too small, insert a blank track to extend it
    if (cyls() < new_cyls || heads() < new_heads)
        m_trackdata[CylHead(new_cyls - 1, new_heads - 1)];
}